

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O2

char * duckdb_re2::utfrune(char *s,Rune c)

{
  byte bVar1;
  uint uVar2;
  undefined8 in_RAX;
  char *pcVar3;
  ulong uVar4;
  undefined8 uStack_28;
  Rune r;
  
  if (c < 0x80) {
    pcVar3 = strchr(s,c);
    return pcVar3;
  }
  uStack_28 = in_RAX;
  do {
    bVar1 = *s;
    if ((char)bVar1 < '\0') {
      uVar2 = chartorune(&r,s);
      if (r == c) {
        return (char *)(byte *)s;
      }
      uVar4 = (ulong)uVar2;
    }
    else {
      if (bVar1 == 0) {
        return (char *)0x0;
      }
      uVar4 = 1;
      if ((uint)bVar1 == c) {
        return (char *)(byte *)s;
      }
    }
    s = (char *)((byte *)s + uVar4);
  } while( true );
}

Assistant:

char*
utfrune(const char *s, Rune c)
{
	int c1;
	Rune r;
	int n;

	if(c < Runesync)		/* not part of utf sequence */
		return strchr((char*)s, c);

	for(;;) {
		c1 = *(unsigned char*)s;
		if(c1 < Runeself) {	/* one byte rune */
			if(c1 == 0)
				return 0;
			if(c1 == c)
				return (char*)s;
			s++;
			continue;
		}
		n = chartorune(&r, s);
		if(r == c)
			return (char*)s;
		s += n;
	}
	return 0;
}